

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_params.hpp
# Opt level: O2

bool __thiscall
chaiscript::dispatch::Attribute_Access<int,_MyException>::call_match
          (Attribute_Access<int,_MyException> *this,Function_Params *vals,
          Type_Conversions_State *param_2)

{
  bool bVar1;
  Type_Info class_type_info;
  Type_Info local_18;
  
  if ((long)vals->m_end - (long)vals->m_begin == 0x10) {
    local_18.m_type_info = (type_info *)&MyException::typeinfo;
    local_18.m_bare_type_info = (type_info *)&MyException::typeinfo;
    local_18.m_flags = 0;
    bVar1 = Type_Info::bare_equal
                      (&((vals->m_begin->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,&local_18);
    return bVar1;
  }
  return false;
}

Assistant:

[[nodiscard]] constexpr std::size_t size() const noexcept { return std::size_t(m_end - m_begin); }